

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevent_fork.h
# Opt level: O0

void __thiscall snmalloc::PreventFork::PreventFork(PreventFork *this)

{
  long lVar1;
  __atomic_base<unsigned_long> _Var2;
  undefined8 *in_FS_OFFSET;
  __int_type_conflict prev;
  memory_order __b;
  
  lVar1 = *(long *)*in_FS_OFFSET;
  *(long *)*in_FS_OFFSET = lVar1 + 1;
  _Var2 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
  if (lVar1 == 0) {
    ensure_init();
    while( true ) {
      LOCK();
      UNLOCK();
      _Var2._M_i = (threads_preventing_fork.super___atomic_base<unsigned_long>._M_i + 2)._M_i;
      if (((ulong)threads_preventing_fork.super___atomic_base<unsigned_long>._M_i & 1) == 0) break;
      LOCK();
      UNLOCK();
      while (std::operator&(seq_cst,__memory_order_mask),
            ((ulong)threads_preventing_fork.super___atomic_base<unsigned_long>._M_i & 1) == 1) {
        AAL_x86::pause();
      }
    }
  }
  threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
  return;
}

Assistant:

PreventFork()
    {
      if (depth_of_prevention++ == 0)
      {
        // Ensure that the system is initialised before we start.
        // Don't do this on nested Prevent calls.
        ensure_init();
        while (true)
        {
          auto prev = threads_preventing_fork.fetch_add(2);
          if (prev % 2 == 0)
            break;

          threads_preventing_fork.fetch_sub(2);

          while ((threads_preventing_fork.load() % 2) == 1)
          {
            Aal::pause();
          }
        };
      }
    }